

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O0

void __thiscall
icu_63::LocaleDisplayNamesImpl::CapitalizationContextSink::put
          (CapitalizationContextSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  undefined4 extraout_var;
  int local_84;
  int32_t titlecaseInt;
  int32_t *intVector;
  uint local_60;
  int32_t len;
  CapContextUsage usageEnum;
  int i;
  ResourceTable contexts;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  CapitalizationContextSink *this_local;
  
  contexts._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&usageEnum,value,errorCode);
  UVar1 = ::U_FAILURE(*(UErrorCode *)contexts._32_8_);
  if (UVar1 == '\0') {
    len = 0;
    while (UVar1 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)&usageEnum,len,(char **)&value_local,value),
          UVar1 != '\0') {
      iVar2 = strcmp((char *)value_local,"key");
      if (iVar2 == 0) {
        local_60 = 4;
LAB_0032fa5a:
        intVector._4_4_ = 0;
        iVar2 = (*(value->super_UObject)._vptr_UObject[8])
                          (value,(long)&intVector + 4,contexts._32_8_);
        UVar1 = ::U_FAILURE(*(UErrorCode *)contexts._32_8_);
        if (UVar1 != '\0') {
          return;
        }
        if (1 < intVector._4_4_) {
          if (this->parent->capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) {
            local_84 = *(int *)CONCAT44(extraout_var,iVar2);
          }
          else {
            local_84 = ((int *)CONCAT44(extraout_var,iVar2))[1];
          }
          if (local_84 != 0) {
            this->parent->fCapitalization[local_60] = '\x01';
            this->hasCapitalizationUsage = '\x01';
          }
        }
      }
      else {
        iVar2 = strcmp((char *)value_local,"keyValue");
        if (iVar2 == 0) {
          local_60 = 5;
          goto LAB_0032fa5a;
        }
        iVar2 = strcmp((char *)value_local,"languages");
        if (iVar2 == 0) {
          local_60 = 0;
          goto LAB_0032fa5a;
        }
        iVar2 = strcmp((char *)value_local,"script");
        if (iVar2 == 0) {
          local_60 = 1;
          goto LAB_0032fa5a;
        }
        iVar2 = strcmp((char *)value_local,"territory");
        if (iVar2 == 0) {
          local_60 = 2;
          goto LAB_0032fa5a;
        }
        iVar2 = strcmp((char *)value_local,"variant");
        if (iVar2 == 0) {
          local_60 = 3;
          goto LAB_0032fa5a;
        }
      }
      len = len + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable contexts = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int i = 0; contexts.getKeyAndValue(i, key, value); ++i) {

            CapContextUsage usageEnum;
            if (uprv_strcmp(key, "key") == 0) {
                usageEnum = kCapContextUsageKey;
            } else if (uprv_strcmp(key, "keyValue") == 0) {
                usageEnum = kCapContextUsageKeyValue;
            } else if (uprv_strcmp(key, "languages") == 0) {
                usageEnum = kCapContextUsageLanguage;
            } else if (uprv_strcmp(key, "script") == 0) {
                usageEnum = kCapContextUsageScript;
            } else if (uprv_strcmp(key, "territory") == 0) {
                usageEnum = kCapContextUsageTerritory;
            } else if (uprv_strcmp(key, "variant") == 0) {
                usageEnum = kCapContextUsageVariant;
            } else {
                continue;
            }

            int32_t len = 0;
            const int32_t* intVector = value.getIntVector(len, errorCode);
            if (U_FAILURE(errorCode)) { return; }
            if (len < 2) { continue; }

            int32_t titlecaseInt = (parent.capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU) ? intVector[0] : intVector[1];
            if (titlecaseInt == 0) { continue; }

            parent.fCapitalization[usageEnum] = TRUE;
            hasCapitalizationUsage = TRUE;
        }
    }